

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_dec_cp_setfromqcd(jpc_dec_cp_t *cp,jpc_qcd_t *qcd)

{
  int iVar1;
  uint_fast16_t *puVar2;
  jpc_dec_ccp_t *pjVar3;
  int iVar4;
  uint_fast16_t uVar5;
  uint_fast16_t uVar6;
  
  iVar1 = cp->numcomps;
  if (0 < iVar1) {
    pjVar3 = cp->ccps;
    iVar4 = 0;
    do {
      if ((pjVar3->flags & 8U) == 0) {
        pjVar3->flags = pjVar3->flags | 2;
        uVar5 = (uint_fast16_t)(qcd->compparms).numstepsizes;
        if (0 < (long)uVar5) {
          puVar2 = (qcd->compparms).stepsizes;
          uVar6 = 0;
          do {
            pjVar3->stepsizes[uVar6] = puVar2[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
        pjVar3->numstepsizes = uVar5;
        pjVar3->numguardbits = (qcd->compparms).numguard;
        pjVar3->qsty = (qcd->compparms).qntsty;
      }
      iVar4 = iVar4 + 1;
      pjVar3 = pjVar3 + 1;
    } while (iVar4 != iVar1);
  }
  *(byte *)&cp->flags = (byte)cp->flags | 2;
  return iVar1;
}

Assistant:

static int jpc_dec_cp_setfromqcd(jpc_dec_cp_t *cp, jpc_qcd_t *qcd)
{
	int compno;
	jpc_dec_ccp_t *ccp;
	for (compno = 0, ccp = cp->ccps; compno < cp->numcomps;
	  ++compno, ++ccp) {
		jpc_dec_cp_setfromqcx(cp, ccp, &qcd->compparms, 0);
	}
	cp->flags |= JPC_QSET;
	return 0;
}